

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractNumericFacetValidator.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::AbstractNumericFacetValidator::serialize
          (AbstractNumericFacetValidator *this,XSerializeEngine *serEng)

{
  bool bVar1;
  XMLNumber *pXVar2;
  undefined8 in_RAX;
  size_t in_RCX;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  int nType;
  NumberType local_24;
  
  local_24 = (NumberType)((ulong)in_RAX >> 0x20);
  if (serEng->fStoreLoad != 0) {
    XSerializeEngine::operator>>(serEng,(int *)&local_24);
    DatatypeValidator::serialize(&this->super_DatatypeValidator,serEng);
    loadClusive(this,serEng,&this->fMaxInclusiveInherited,&this->fMaxInclusive,local_24,1);
    loadClusive(this,serEng,&this->fMaxExclusiveInherited,&this->fMaxExclusive,local_24,2);
    loadClusive(this,serEng,&this->fMinInclusiveInherited,&this->fMinInclusive,local_24,3);
    loadClusive(this,serEng,&this->fMinExclusiveInherited,&this->fMinExclusive,local_24,4);
    XSerializeEngine::operator>>(serEng,&this->fEnumerationInherited);
    XTemplateSerializer::loadObject(&this->fStrEnumeration,8,true,serEng);
    XTemplateSerializer::loadObject(&this->fEnumeration,8,true,local_24,serEng);
    return;
  }
  DatatypeValidator::serialize(&this->super_DatatypeValidator,serEng);
  bVar1 = this->fMaxInclusiveInherited;
  pXVar2 = this->fMaxInclusive;
  XSerializeEngine::operator<<(serEng,bVar1);
  if (bVar1 == false) {
    XSerializeEngine::write(serEng,(int)pXVar2,__buf,in_RCX);
  }
  bVar1 = this->fMaxExclusiveInherited;
  pXVar2 = this->fMaxExclusive;
  XSerializeEngine::operator<<(serEng,bVar1);
  if (bVar1 == false) {
    XSerializeEngine::write(serEng,(int)pXVar2,__buf_00,in_RCX);
  }
  bVar1 = this->fMinInclusiveInherited;
  pXVar2 = this->fMinInclusive;
  XSerializeEngine::operator<<(serEng,bVar1);
  if (bVar1 == false) {
    XSerializeEngine::write(serEng,(int)pXVar2,__buf_01,in_RCX);
  }
  bVar1 = this->fMinExclusiveInherited;
  pXVar2 = this->fMinExclusive;
  XSerializeEngine::operator<<(serEng,bVar1);
  if (bVar1 == false) {
    XSerializeEngine::write(serEng,(int)pXVar2,__buf_02,in_RCX);
  }
  XSerializeEngine::operator<<(serEng,this->fEnumerationInherited);
  XTemplateSerializer::storeObject(this->fStrEnumeration,serEng);
  XTemplateSerializer::storeObject(this->fEnumeration,serEng);
  return;
}

Assistant:

void AbstractNumericFacetValidator::serialize(XSerializeEngine& serEng)
{

    if (serEng.isStoring())
    {

        /***
         * don't move this line out of the if statement,
         * it is done purposely to allow AbstractNumericFacetValidator
         * read the number type information before DatatypeValidator
         * during loading
         ***/
        DatatypeValidator::serialize(serEng);

        // need not write type info for the XMLNumber since
        // the derivative class has done that       
        storeClusive(serEng, fMaxInclusiveInherited, fMaxInclusive);
        storeClusive(serEng, fMaxExclusiveInherited, fMaxExclusive);
        storeClusive(serEng, fMinInclusiveInherited, fMinInclusive);
        storeClusive(serEng, fMinExclusiveInherited, fMinExclusive);

        serEng<<fEnumerationInherited;

        /***
         * Serialize RefArrayVectorOf<XMLCh>
         * Serialize RefVectorOf<XMLNumber>
         ***/
        XTemplateSerializer::storeObject(fStrEnumeration, serEng);
        XTemplateSerializer::storeObject(fEnumeration, serEng);
   
    }
    else
    {
        // Read the number type info for the XMLNumber FIRST!!!
        int                     nType;
        XMLNumber::NumberType   numType;
        serEng>>nType;
        numType = (XMLNumber::NumberType) nType;

        DatatypeValidator::serialize(serEng);

        loadClusive(serEng, fMaxInclusiveInherited, fMaxInclusive, numType, 1);
        loadClusive(serEng, fMaxExclusiveInherited, fMaxExclusive, numType, 2);
        loadClusive(serEng, fMinInclusiveInherited, fMinInclusive, numType, 3);
        loadClusive(serEng, fMinExclusiveInherited, fMinExclusive, numType, 4);

        serEng>>fEnumerationInherited;

        /***
         *  Deserialize RefArrayVectorOf<XMLCh>         
         *  Deserialize RefVectorOf<XMLNumber>   
         ***/
        XTemplateSerializer::loadObject(&fStrEnumeration, 8, true, serEng);
        XTemplateSerializer::loadObject(&fEnumeration, 8, true, numType, serEng);

    }

}